

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

void __thiscall
capnp::MallocMessageBuilder::MallocMessageBuilder
          (MallocMessageBuilder *this,ArrayPtr<capnp::word> firstSegment,
          AllocationStrategy allocationStrategy)

{
  word *pwVar1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  _kjCondition.left = firstSegment.size_;
  pwVar1 = firstSegment.ptr;
  (this->super_MessageBuilder).allocatedArena = false;
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_0028cb28;
  *(int *)&(this->super_MessageBuilder).field_0xbc = (int)firstSegment.size_;
  this->allocationStrategy = allocationStrategy;
  this->ownFirstSegment = false;
  this->returnedFirstSegment = false;
  this->firstSegment = pwVar1;
  (this->moreSegments).builder.ptr = (void **)0x0;
  (this->moreSegments).builder.pos = (RemoveConst<void_*> *)0x0;
  (this->moreSegments).builder.endPtr = (void **)0x0;
  (this->moreSegments).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.left == 0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0xdd,FAILED,"firstSegment.size() > 0",
               "_kjCondition,\"First segment size must be non-zero.\"",&_kjCondition,
               (char (*) [37])"First segment size must be non-zero.");
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition.result = pwVar1->content == 0;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    return;
  }
  _kjCondition.left = (unsigned_long)pwVar1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[30]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
             ,0xe1,FAILED,"*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0",
             "_kjCondition,\"First segment must be zeroed.\"",
             (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
             (char (*) [30])"First segment must be zeroed.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

MallocMessageBuilder::MallocMessageBuilder(
    kj::ArrayPtr<word> firstSegment, AllocationStrategy allocationStrategy)
    : nextSize(firstSegment.size()), allocationStrategy(allocationStrategy),
      ownFirstSegment(false), returnedFirstSegment(false), firstSegment(firstSegment.begin()) {
  KJ_REQUIRE(firstSegment.size() > 0, "First segment size must be non-zero.");

  // Checking just the first word should catch most cases of failing to zero the segment.
  KJ_REQUIRE(*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0,
          "First segment must be zeroed.");
}